

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddText(ImDrawList *this,ImFont *font,float font_size,ImVec2 *pos,ImU32 col,
                   char *text_begin,char *text_end,float wrap_width,ImVec4 *cpu_fine_clip_rect)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  uint in_ECX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  float *in_stack_00000008;
  ImVec4 clip_rect;
  undefined4 in_stack_00000050;
  undefined4 in_stack_00000060;
  ImFont *in_stack_00000078;
  float local_4c;
  float fStack_48;
  float local_44;
  float fStack_40;
  char *local_38;
  
  if ((in_ECX & 0xff000000) != 0) {
    local_38 = in_R9;
    if (in_R9 == (char *)0x0) {
      sVar3 = strlen(in_R8);
      local_38 = in_R8 + sVar3;
    }
    if (in_R8 != local_38) {
      uVar1 = *(undefined8 *)(in_RDI + 0x88);
      uVar2 = *(undefined8 *)(in_RDI + 0x90);
      if (in_stack_00000008 != (float *)0x0) {
        local_4c = (float)uVar1;
        ImMax<float>(local_4c,*in_stack_00000008);
        fStack_48 = (float)((ulong)uVar1 >> 0x20);
        ImMax<float>(fStack_48,in_stack_00000008[1]);
        local_44 = (float)uVar2;
        ImMin<float>(local_44,in_stack_00000008[2]);
        fStack_40 = (float)((ulong)uVar2 >> 0x20);
        ImMin<float>(fStack_40,in_stack_00000008[3]);
      }
      ImFont::RenderText(in_stack_00000078,this,font._4_4_,(ImVec2)cpu_fine_clip_rect,(ImU32)font,
                         (ImVec4 *)CONCAT44(font_size,in_stack_00000060),(char *)pos,
                         (char *)CONCAT44(col,in_stack_00000050),text_begin._4_4_,text_begin._3_1_);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddText(const ImFont* font, float font_size, const ImVec2& pos, ImU32 col, const char* text_begin, const char* text_end, float wrap_width, const ImVec4* cpu_fine_clip_rect)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (text_end == NULL)
        text_end = text_begin + strlen(text_begin);
    if (text_begin == text_end)
        return;

    // Pull default font/size from the shared ImDrawListSharedData instance
    if (font == NULL)
        font = _Data->Font;
    if (font_size == 0.0f)
        font_size = _Data->FontSize;

    IM_ASSERT(font->ContainerAtlas->TexID == _CmdHeader.TextureId);  // Use high-level ImGui::PushFont() or low-level ImDrawList::PushTextureId() to change font.

    ImVec4 clip_rect = _CmdHeader.ClipRect;
    if (cpu_fine_clip_rect)
    {
        clip_rect.x = ImMax(clip_rect.x, cpu_fine_clip_rect->x);
        clip_rect.y = ImMax(clip_rect.y, cpu_fine_clip_rect->y);
        clip_rect.z = ImMin(clip_rect.z, cpu_fine_clip_rect->z);
        clip_rect.w = ImMin(clip_rect.w, cpu_fine_clip_rect->w);
    }
    font->RenderText(this, font_size, pos, col, clip_rect, text_begin, text_end, wrap_width, cpu_fine_clip_rect != NULL);
}